

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

Oop __thiscall Lodtalk::ASTInterpreter::visitSequenceNode(ASTInterpreter *this,SequenceNode *node)

{
  bool bVar1;
  bool bVar2;
  LocalDeclarations *pLVar3;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *this_00;
  reference ppNVar4;
  Node **child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__range1;
  bool first;
  SequenceNode *node_local;
  ASTInterpreter *this_local;
  
  pLVar3 = AST::SequenceNode::getLocalDeclarations(node);
  if (pLVar3 != (LocalDeclarations *)0x0) {
    __assert_fail("0 && \"unimplemented\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Compiler.cpp"
                  ,0x23b,"virtual Oop Lodtalk::ASTInterpreter::visitSequenceNode(SequenceNode *)");
  }
  bVar1 = true;
  this_00 = AST::SequenceNode::getChildren(node);
  __end1 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::begin(this_00);
  child = (Node **)std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::end
                             (this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
                                *)&child);
    if (!bVar2) break;
    ppNVar4 = __gnu_cxx::
              __normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
              ::operator*(&__end1);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      (*this->interpreter->_vptr_InterpreterProxy[6])();
    }
    (*(*ppNVar4)->_vptr_Node[2])(*ppNVar4,this);
    __gnu_cxx::
    __normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
    ::operator++(&__end1);
  }
  Oop::Oop((Oop *)&this_local);
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
}

Assistant:

Oop ASTInterpreter::visitSequenceNode(SequenceNode *node)
{
	if(node->getLocalDeclarations())
	{
		// TODO: Create the new scope
		assert(0 && "unimplemented");
		abort();
	}

    bool first = true;
	for(auto &child : node->getChildren())
    {
        if(first)
            first = false;
        else
            interpreter->popOop();
		child->acceptVisitor(this);
    }

	return Oop();
}